

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

UnitBoundedPolynomial1<5U> *
UnitBoundedPolynomial1<5U>::fit(Matrix<double,_3,_1,_0,_3,_1> *a,Matrix<double,_3,_1,_0,_3,_1> *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  UnitBoundedPolynomial1<5U> *in_RDI;
  
  dVar5 = (a->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar6 = (a->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  in_RDI->coeffs[0] = dVar5;
  in_RDI->coeffs[1] = dVar6;
  dVar1 = (a->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  in_RDI->coeffs[2] = dVar1 * 0.5;
  dVar2 = (b->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (b->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  dVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [2];
  in_RDI->coeffs[3] =
       dVar4 * 0.5 + dVar3 * -4.0 + dVar2 * 10.0 + dVar1 * -1.5 + dVar5 * -10.0 + dVar6 * -6.0;
  in_RDI->coeffs[4] =
       dVar4 * -1.0 + dVar3 * 7.0 + dVar2 * -15.0 + dVar1 * 1.5 + dVar5 * 15.0 + dVar6 * 8.0;
  in_RDI->coeffs[5] =
       dVar4 * 0.5 + dVar3 * -3.0 + dVar2 * 6.0 + dVar1 * -0.5 + dVar5 * -6.0 + dVar6 * -3.0;
  return in_RDI;
}

Assistant:

UnitBoundedPolynomial1<5> UnitBoundedPolynomial1<5>::fit(const Matrix<double, RequiredValues, 1> a, 
                                                         const Matrix<double, RequiredValues, 1> b)
{
    UnitBoundedPolynomial1<5> out;
    out.coeffs[0] = a[0];
    out.coeffs[1] = a[1];
    out.coeffs[2] = 0.5 * a[2];
    out.coeffs[3] = -10 * a[0] - 6 * a[1] - 1.5 * a[2] + 10 * b[0] - 4 * b[1] + 0.5 * b[2];
    out.coeffs[4] =  15 * a[0] + 8 * a[1] + 1.5 * a[2] - 15 * b[0] + 7 * b[1] - 1.0 * b[2];
    out.coeffs[5] = - 6 * a[0] - 3 * a[1] - 0.5 * a[2] +  6 * b[0] - 3 * b[1] + 0.5 * b[2];

    return out;
}